

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_first_byte,bool want_earliest_match,
          bool run_forward)

{
  byte bVar1;
  Prog *pPVar2;
  const_pointer pcVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  void *pvVar8;
  State *pSVar9;
  State *pSVar10;
  State *pSVar11;
  byte *pbVar12;
  byte *pbVar13;
  undefined3 in_register_00000081;
  uint c;
  byte *__s;
  ulong uVar14;
  StateSaver save_start;
  StateSaver save_s;
  byte *local_250;
  bool local_248;
  byte *local_230;
  StateSaver local_200;
  StateSaver local_1d8;
  LogMessage local_1b0;
  
  __s = (byte *)(params->text).data_;
  pbVar13 = __s + (params->text).size_;
  pbVar6 = __s;
  pbVar7 = pbVar13;
  if (CONCAT31(in_register_00000081,run_forward) != 0) {
    pbVar6 = pbVar13;
    pbVar7 = __s;
  }
  pSVar11 = params->start;
  pPVar2 = this->prog_;
  if ((pSVar11->flag_ & 0x100) == 0) {
    local_248 = false;
    local_250 = (byte *)0x0;
  }
  else {
    if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
      for (uVar14 = (ulong)(uint)pSVar11->ninst_;
          (0 < (int)uVar14 && (pSVar11->inst_[uVar14 - 1] != -2)); uVar14 = uVar14 - 1) {
        SparseSetT<void>::insert(params->matches,pSVar11->inst_[uVar14 - 1]);
      }
    }
    local_248 = true;
    local_250 = pbVar7;
    if (want_earliest_match) {
      params->ep = (char *)pbVar7;
      return true;
    }
  }
  local_230 = (byte *)0x0;
  pSVar9 = pSVar11;
  do {
    do {
      if ((long)pbVar7 - (long)pbVar6 == 0) {
        pbVar13 = pbVar7;
        __s = pbVar7;
        if (run_forward) {
LAB_001a482b:
          pbVar7 = (byte *)((params->text).data_ + (params->text).size_);
          __s = pbVar13;
          if (pbVar7 == (byte *)((params->context).data_ + (params->context).size_))
          goto LAB_001a486c;
LAB_001a485a:
          c = (uint)*pbVar7;
          uVar5 = (uint)this->prog_->bytemap_[*pbVar7];
        }
        else {
LAB_001a484a:
          pcVar3 = (params->text).data_;
          pbVar13 = __s;
          if (pcVar3 != (params->context).data_) {
            pbVar7 = (byte *)(pcVar3 + -1);
            goto LAB_001a485a;
          }
LAB_001a486c:
          uVar5 = this->prog_->bytemap_range_;
          c = 0x100;
          __s = pbVar13;
        }
        pSVar10 = (State *)(&pSVar9[1].inst_)[(int)uVar5];
        if ((pSVar10 == (State *)0x0) &&
           (pSVar10 = RunStateOnByteUnlocked(this,pSVar9,c), pSVar10 == (State *)0x0)) {
          StateSaver::StateSaver(&local_200,this,pSVar9);
          ResetCache(this,params->cache_lock);
          pSVar11 = StateSaver::Restore(&local_200);
          if (pSVar11 == (State *)0x0) {
LAB_001a4932:
            params->failed = true;
            bVar4 = false;
            pSVar10 = (State *)0x0;
          }
          else {
            pSVar10 = RunStateOnByteUnlocked(this,pSVar11,c);
            if (pSVar10 == (State *)0x0) {
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                         ,0x5f6);
              std::operator<<((ostream *)&local_1b0.str_,"RunStateOnByteUnlocked failed after Reset"
                             );
              LogMessage::~LogMessage(&local_1b0);
              goto LAB_001a4932;
            }
            bVar4 = true;
          }
          StateSaver::~StateSaver(&local_200);
          if (!bVar4) {
            return false;
          }
        }
        if ((State *)0x2 < pSVar10) {
          if ((((pSVar10->flag_ & 0x100) != 0) &&
              (local_248 = true, local_250 = __s, params->matches != (SparseSet *)0x0)) &&
             (this->kind_ == kManyMatch)) {
            for (uVar14 = (ulong)(uint)pSVar10->ninst_;
                (0 < (int)uVar14 && (pSVar10->inst_[uVar14 - 1] != -2)); uVar14 = uVar14 - 1) {
              SparseSetT<void>::insert(params->matches,pSVar10->inst_[uVar14 - 1]);
            }
          }
LAB_001a49b3:
          params->ep = (char *)local_250;
          return local_248;
        }
joined_r0x001a481b:
        pbVar12 = pbVar6;
        if (pSVar10 == (State *)0x1) goto LAB_001a49b3;
        goto LAB_001a49a6;
      }
      if ((have_first_byte) && (pSVar9 == pSVar11)) {
        if (run_forward) {
          pbVar7 = (byte *)memchr(pbVar7,params->first_byte,(long)pbVar6 - (long)pbVar7);
          if (pbVar7 == (byte *)0x0) goto LAB_001a482b;
          goto LAB_001a461b;
        }
        pvVar8 = memrchr(__s,params->first_byte,(long)pbVar7 - (long)pbVar6);
        if (pvVar8 == (void *)0x0) goto LAB_001a484a;
        pbVar7 = (byte *)((long)pvVar8 + 1);
LAB_001a463c:
        pbVar7 = pbVar7 + -1;
        pbVar12 = pbVar7;
      }
      else {
        if (!run_forward) goto LAB_001a463c;
LAB_001a461b:
        pbVar12 = pbVar7 + 1;
      }
      bVar1 = *pbVar7;
      pSVar10 = (State *)(&pSVar9[1].inst_)[pPVar2->bytemap_[bVar1]];
      if (pSVar10 == (State *)0x0) {
        pSVar10 = RunStateOnByteUnlocked(this,pSVar9,(uint)bVar1);
        if (pSVar10 == (State *)0x0) {
          if (((dfa_should_bail_when_slow == '\x01') && (local_230 != (byte *)0x0)) &&
             (((ulong)((long)pbVar12 - (long)local_230) <
               (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
            params->failed = true;
            return false;
          }
          StateSaver::StateSaver(&local_200,this,pSVar11);
          StateSaver::StateSaver(&local_1d8,this,pSVar9);
          ResetCache(this,params->cache_lock);
          pSVar11 = StateSaver::Restore(&local_200);
          if ((pSVar11 == (State *)0x0) ||
             (pSVar9 = StateSaver::Restore(&local_1d8), pSVar9 == (State *)0x0)) {
LAB_001a47dc:
            params->failed = true;
            bVar4 = false;
            pSVar10 = (State *)0x0;
          }
          else {
            pSVar10 = RunStateOnByteUnlocked(this,pSVar9,(uint)bVar1);
            if (pSVar10 == (State *)0x0) {
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                         ,0x5ad);
              std::operator<<((ostream *)&local_1b0.str_,
                              "RunStateOnByteUnlocked failed after ResetCache");
              LogMessage::~LogMessage(&local_1b0);
              goto LAB_001a47dc;
            }
            bVar4 = true;
          }
          StateSaver::~StateSaver(&local_1d8);
          StateSaver::~StateSaver(&local_200);
          local_230 = pbVar12;
          if (!bVar4) {
            return false;
          }
        }
      }
      if (pSVar10 < (State *)0x3) goto joined_r0x001a481b;
      pbVar7 = pbVar12;
      pSVar9 = pSVar10;
    } while ((pSVar10->flag_ & 0x100) == 0);
    if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
      for (uVar14 = (ulong)(uint)pSVar10->ninst_;
          (0 < (int)uVar14 && (pSVar10->inst_[uVar14 - 1] != -2)); uVar14 = uVar14 - 1) {
        SparseSetT<void>::insert(params->matches,pSVar10->inst_[uVar14 - 1]);
      }
    }
    local_250 = pbVar12 + (-(ulong)run_forward | 1);
    local_248 = true;
    pbVar12 = local_250;
  } while (!want_earliest_match);
LAB_001a49a6:
  params->ep = (char *)pbVar12;
  return true;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_first_byte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;
  if (ExtraDebug)
    fprintf(stderr, "@stx: %s\n", DumpState(s).c_str());

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @stx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (ExtraDebug)
      fprintf(stderr, "@%td: %s\n",
              p - bp, DumpState(s).c_str());

    if (have_first_byte && s == start) {
      // In start state, only way out is to find first_byte,
      // so use optimized assembly in memchr to skip ahead.
      // If first_byte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->first_byte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->first_byte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (ExtraDebug)
        fprintf(stderr, "match @%td! [%s]\n",
                lastmatch - bp, DumpState(s).c_str());
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  if (ExtraDebug)
    fprintf(stderr, "@etx: %s\n", DumpState(s).c_str());

  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @etx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}